

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_Error FT_Stream_ReadAt(FT_Stream stream,FT_ULong pos,FT_Byte *buffer,FT_ULong count)

{
  size_t local_40;
  FT_ULong read_bytes;
  FT_Error error;
  FT_ULong count_local;
  FT_Byte *buffer_local;
  FT_ULong pos_local;
  FT_Stream stream_local;
  
  read_bytes._4_4_ = 0;
  if (pos < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      local_40 = stream->size - pos;
      if (count < local_40) {
        local_40 = count;
      }
      memcpy(buffer,stream->base + pos,local_40);
    }
    else {
      local_40 = (*stream->read)(stream,pos,buffer,count);
    }
    stream->pos = pos + local_40;
    if (local_40 < count) {
      read_bytes._4_4_ = 0x55;
    }
    stream_local._4_4_ = read_bytes._4_4_;
  }
  else {
    stream_local._4_4_ = 0x55;
  }
  return stream_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ReadAt( FT_Stream  stream,
                    FT_ULong   pos,
                    FT_Byte*   buffer,
                    FT_ULong   count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  read_bytes;


    if ( pos >= stream->size )
    {
      FT_ERROR(( "FT_Stream_ReadAt:"
                 " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
                 pos, stream->size ));

      return FT_THROW( Invalid_Stream_Operation );
    }

    if ( stream->read )
      read_bytes = stream->read( stream, pos, buffer, count );
    else
    {
      read_bytes = stream->size - pos;
      if ( read_bytes > count )
        read_bytes = count;

      FT_MEM_COPY( buffer, stream->base + pos, read_bytes );
    }

    stream->pos = pos + read_bytes;

    if ( read_bytes < count )
    {
      FT_ERROR(( "FT_Stream_ReadAt:"
                 " invalid read; expected %lu bytes, got %lu\n",
                 count, read_bytes ));

      error = FT_THROW( Invalid_Stream_Operation );
    }

    return error;
  }